

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_Snapshot::_Run(_Test_Snapshot *this)

{
  DB *pDVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  allocator local_249;
  string local_248;
  Snapshot *local_228;
  Snapshot *local_220;
  string local_218;
  Snapshot *local_1f8;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  Tester local_1d0;
  
  do {
    std::__cxx11::string::string((string *)&local_1d0,"foo",(allocator *)&local_248);
    std::__cxx11::string::string((string *)&local_218,"v1",&local_249);
    DBTest::Put((DBTest *)(local_1e0 + 8),(string *)this,(string *)&local_1d0);
    Status::~Status((Status *)(local_1e0 + 8));
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1d0);
    iVar3 = (*((this->super_DBTest).db_)->_vptr_DB[7])();
    local_220 = (Snapshot *)CONCAT44(extraout_var,iVar3);
    std::__cxx11::string::string((string *)&local_1d0,"foo",(allocator *)&local_248);
    std::__cxx11::string::string((string *)&local_218,"v2",&local_249);
    DBTest::Put((DBTest *)local_1e0,(string *)this,(string *)&local_1d0);
    Status::~Status((Status *)local_1e0);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1d0);
    iVar3 = (*((this->super_DBTest).db_)->_vptr_DB[7])();
    local_228 = (Snapshot *)CONCAT44(extraout_var_00,iVar3);
    std::__cxx11::string::string((string *)&local_1d0,"foo",(allocator *)&local_248);
    std::__cxx11::string::string((string *)&local_218,"v3",&local_249);
    DBTest::Put((DBTest *)(local_1f0 + 8),(string *)this,(string *)&local_1d0);
    Status::~Status((Status *)(local_1f0 + 8));
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1d0);
    iVar3 = (*((this->super_DBTest).db_)->_vptr_DB[7])();
    local_1f8 = (Snapshot *)CONCAT44(extraout_var_01,iVar3);
    std::__cxx11::string::string((string *)&local_1d0,"foo",(allocator *)&local_248);
    std::__cxx11::string::string((string *)&local_218,"v4",&local_249);
    DBTest::Put((DBTest *)local_1f0,(string *)this,(string *)&local_1d0);
    Status::~Status((Status *)local_1f0);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1d0);
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x519);
    std::__cxx11::string::string((string *)&local_248,"foo",&local_249);
    DBTest::Get(&local_218,&this->super_DBTest,&local_248,local_220);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1d0,(char (*) [3])"v1",&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_248);
    test::Tester::~Tester(&local_1d0);
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x51a);
    std::__cxx11::string::string((string *)&local_248,"foo",&local_249);
    DBTest::Get(&local_218,&this->super_DBTest,&local_248,local_228);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1d0,(char (*) [3])"v2",&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_248);
    test::Tester::~Tester(&local_1d0);
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x51b);
    std::__cxx11::string::string((string *)&local_248,"foo",&local_249);
    DBTest::Get(&local_218,&this->super_DBTest,&local_248,local_1f8);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1d0,(char (*) [3])"v3",&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_248);
    test::Tester::~Tester(&local_1d0);
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x51c);
    std::__cxx11::string::string((string *)&local_248,"foo",&local_249);
    DBTest::Get(&local_218,&this->super_DBTest,&local_248,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1d0,(char (*) [3])"v4",&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_248);
    test::Tester::~Tester(&local_1d0);
    pDVar1 = (this->super_DBTest).db_;
    (*pDVar1->_vptr_DB[8])(pDVar1,local_1f8);
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x51f);
    std::__cxx11::string::string((string *)&local_248,"foo",&local_249);
    DBTest::Get(&local_218,&this->super_DBTest,&local_248,local_220);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1d0,(char (*) [3])"v1",&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_248);
    test::Tester::~Tester(&local_1d0);
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x520);
    std::__cxx11::string::string((string *)&local_248,"foo",&local_249);
    DBTest::Get(&local_218,&this->super_DBTest,&local_248,local_228);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1d0,(char (*) [3])"v2",&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_248);
    test::Tester::~Tester(&local_1d0);
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x521);
    std::__cxx11::string::string((string *)&local_248,"foo",&local_249);
    DBTest::Get(&local_218,&this->super_DBTest,&local_248,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1d0,(char (*) [3])"v4",&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_248);
    test::Tester::~Tester(&local_1d0);
    pDVar1 = (this->super_DBTest).db_;
    (*pDVar1->_vptr_DB[8])(pDVar1,local_220);
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x524);
    std::__cxx11::string::string((string *)&local_248,"foo",&local_249);
    DBTest::Get(&local_218,&this->super_DBTest,&local_248,local_228);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1d0,(char (*) [3])"v2",&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_248);
    test::Tester::~Tester(&local_1d0);
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x525);
    std::__cxx11::string::string((string *)&local_248,"foo",&local_249);
    DBTest::Get(&local_218,&this->super_DBTest,&local_248,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1d0,(char (*) [3])"v4",&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_248);
    test::Tester::~Tester(&local_1d0);
    pDVar1 = (this->super_DBTest).db_;
    (*pDVar1->_vptr_DB[8])(pDVar1,local_228);
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x528);
    std::__cxx11::string::string((string *)&local_248,"foo",&local_249);
    DBTest::Get(&local_218,&this->super_DBTest,&local_248,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1d0,(char (*) [3])"v4",&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_248);
    test::Tester::~Tester(&local_1d0);
    bVar2 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar2);
  return;
}

Assistant:

TEST(DBTest, Snapshot) {
  do {
    Put("foo", "v1");
    const Snapshot* s1 = db_->GetSnapshot();
    Put("foo", "v2");
    const Snapshot* s2 = db_->GetSnapshot();
    Put("foo", "v3");
    const Snapshot* s3 = db_->GetSnapshot();

    Put("foo", "v4");
    ASSERT_EQ("v1", Get("foo", s1));
    ASSERT_EQ("v2", Get("foo", s2));
    ASSERT_EQ("v3", Get("foo", s3));
    ASSERT_EQ("v4", Get("foo"));

    db_->ReleaseSnapshot(s3);
    ASSERT_EQ("v1", Get("foo", s1));
    ASSERT_EQ("v2", Get("foo", s2));
    ASSERT_EQ("v4", Get("foo"));

    db_->ReleaseSnapshot(s1);
    ASSERT_EQ("v2", Get("foo", s2));
    ASSERT_EQ("v4", Get("foo"));

    db_->ReleaseSnapshot(s2);
    ASSERT_EQ("v4", Get("foo"));
  } while (ChangeOptions());
}